

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O2

int queryIntItem(void *userData,char *queryItemKey,size_t queryItemKeyLen,long queryItemValue)

{
  uint uVar1;
  IResultCapture *pIVar2;
  mapped_type *pmVar3;
  undefined8 uVar4;
  allocator<char> local_32b;
  allocator<char> local_32a;
  allocator<char> local_329;
  string local_328;
  string local_308 [32];
  string local_2e8;
  AssertionInfo __assertionInfo194;
  ExpressionResultBuilder local_258;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"CAPTURE",&local_329);
  std::__cxx11::string::string<std::allocator<char>>
            (local_308,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
             ,&local_32a);
  std::__cxx11::string::string((string *)&local_258,local_308);
  local_258.m_data.message._M_dataplus._M_p = (pointer)0xc2;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"",&local_32b);
  Catch::AssertionInfo::AssertionInfo
            (&__assertionInfo194,&local_2e8,(SourceLineInfo *)&local_258,&local_328,
             ContinueOnFailure);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::~string((string *)&local_2e8);
  pIVar2 = Catch::getResultCapture();
  Catch::ExpressionResultBuilder::ExpressionResultBuilder(&local_258,Info);
  std::operator<<((ostream *)&local_258.m_stream,"queryItemKey := ");
  std::operator<<((ostream *)&local_258.m_stream,queryItemKey);
  uVar1 = (*pIVar2->_vptr_IResultCapture[8])(pIVar2,&local_258,&__assertionInfo194);
  Catch::ExpressionResultBuilder::~ExpressionResultBuilder(&local_258);
  if ((uVar1 & 4) != 0) {
    uVar4 = __cxa_allocate_exception(1);
    __cxa_throw(uVar4,&Catch::TestFailureException::typeinfo,0);
  }
  Catch::AssertionInfo::~AssertionInfo(&__assertionInfo194);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"CAPTURE",&local_329);
  std::__cxx11::string::string<std::allocator<char>>
            (local_308,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
             ,&local_32a);
  std::__cxx11::string::string((string *)&local_258,local_308);
  local_258.m_data.message._M_dataplus._M_p = (pointer)0xc3;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"",&local_32b);
  Catch::AssertionInfo::AssertionInfo
            (&__assertionInfo194,&local_2e8,(SourceLineInfo *)&local_258,&local_328,
             ContinueOnFailure);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::~string((string *)&local_2e8);
  pIVar2 = Catch::getResultCapture();
  Catch::ExpressionResultBuilder::ExpressionResultBuilder(&local_258,Info);
  std::operator<<((ostream *)&local_258.m_stream,"queryItemKeyLen := ");
  std::ostream::_M_insert<unsigned_long>((ulong)&local_258.m_stream);
  uVar1 = (*pIVar2->_vptr_IResultCapture[8])(pIVar2,&local_258,&__assertionInfo194);
  Catch::ExpressionResultBuilder::~ExpressionResultBuilder(&local_258);
  if ((uVar1 & 4) == 0) {
    Catch::AssertionInfo::~AssertionInfo(&__assertionInfo194);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"CAPTURE",&local_329);
    std::__cxx11::string::string<std::allocator<char>>
              (local_308,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
               ,&local_32a);
    std::__cxx11::string::string((string *)&local_258,local_308);
    local_258.m_data.message._M_dataplus._M_p = (pointer)0xc4;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"",&local_32b);
    Catch::AssertionInfo::AssertionInfo
              (&__assertionInfo194,&local_2e8,(SourceLineInfo *)&local_258,&local_328,
               ContinueOnFailure);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string(local_308);
    std::__cxx11::string::~string((string *)&local_2e8);
    pIVar2 = Catch::getResultCapture();
    Catch::ExpressionResultBuilder::ExpressionResultBuilder(&local_258,Info);
    std::operator<<((ostream *)&local_258.m_stream,"queryItemValue := ");
    std::ostream::_M_insert<long>((long)&local_258.m_stream);
    uVar1 = (*pIVar2->_vptr_IResultCapture[8])(pIVar2,&local_258,&__assertionInfo194);
    Catch::ExpressionResultBuilder::~ExpressionResultBuilder(&local_258);
    if ((uVar1 & 4) == 0) {
      Catch::AssertionInfo::~AssertionInfo(&__assertionInfo194);
      local_258.m_data.reconstructedExpression._M_dataplus._M_p =
           (pointer)&local_258.m_data.reconstructedExpression.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_258,queryItemKey,queryItemKey + queryItemKeyLen);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                             *)((long)userData + 0x150),(key_type *)&local_258);
      *pmVar3 = queryItemValue;
      std::__cxx11::string::~string((string *)&local_258);
      return 1;
    }
    uVar4 = __cxa_allocate_exception(1);
    __cxa_throw(uVar4,&Catch::TestFailureException::typeinfo,0);
  }
  uVar4 = __cxa_allocate_exception(1);
  __cxa_throw(uVar4,&Catch::TestFailureException::typeinfo,0);
}

Assistant:

inline int queryIntItem(void* userData, const char* queryItemKey, size_t queryItemKeyLen, long int queryItemValue)
{
    CAPTURE(queryItemKey);
    CAPTURE(queryItemKeyLen);
    CAPTURE(queryItemValue);
    static_cast<URI*>(userData)->queryIntItems[std::string(queryItemKey,queryItemKeyLen)] = queryItemValue;
    return 1;
}